

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void av1_highbd_inv_txfm2d_add_universe_sse4_1
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob,
               int bd)

{
  undefined1 in_CL;
  int in_stack_00000594;
  TX_SIZE in_stack_0000059a;
  TX_TYPE in_stack_0000059b;
  int in_stack_0000059c;
  uint16_t *in_stack_000005a0;
  int32_t *in_stack_000005a8;
  int in_stack_000005d4;
  TX_SIZE in_stack_000005da;
  TX_TYPE in_stack_000005db;
  int in_stack_000005dc;
  uint16_t *in_stack_000005e0;
  int32_t *in_stack_000005e8;
  int in_stack_000006c0;
  int in_stack_00000800;
  int in_stack_00001284;
  TX_SIZE in_stack_0000128a;
  TX_TYPE in_stack_0000128b;
  int in_stack_0000128c;
  uint16_t *in_stack_00001290;
  int32_t *in_stack_00001298;
  int in_stack_000013b0;
  int in_stack_000044d4;
  TX_SIZE in_stack_000044da;
  TX_TYPE in_stack_000044db;
  int in_stack_000044dc;
  uint16_t *in_stack_000044e0;
  int32_t *in_stack_000044e8;
  int in_stack_00004700;
  
  switch(in_CL) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
    highbd_inv_txfm2d_add_no_identity_sse41
              (in_stack_000044e8,in_stack_000044e0,in_stack_000044dc,in_stack_000044db,
               in_stack_000044da,in_stack_000044d4,in_stack_00004700);
    break;
  case 9:
    highbd_inv_txfm2d_add_idtx_ssse41
              (in_stack_00001298,in_stack_00001290,in_stack_0000128c,in_stack_0000128b,
               in_stack_0000128a,in_stack_00001284,in_stack_000013b0);
    break;
  case 10:
  case 0xc:
  case 0xe:
    highbd_inv_txfm2d_add_h_identity_ssse41
              (in_stack_000005a8,in_stack_000005a0,in_stack_0000059c,in_stack_0000059b,
               in_stack_0000059a,in_stack_00000594,in_stack_000006c0);
    break;
  case 0xb:
  case 0xd:
  case 0xf:
    highbd_inv_txfm2d_add_v_identity_ssse41
              (in_stack_000005e8,in_stack_000005e0,in_stack_000005dc,in_stack_000005db,
               in_stack_000005da,in_stack_000005d4,in_stack_00000800);
  }
  return;
}

Assistant:

void av1_highbd_inv_txfm2d_add_universe_sse4_1(const int32_t *input,
                                               uint8_t *output, int stride,
                                               TX_TYPE tx_type, TX_SIZE tx_size,
                                               int eob, const int bd) {
  switch (tx_type) {
    case DCT_DCT:
    case ADST_DCT:
    case DCT_ADST:
    case ADST_ADST:
    case FLIPADST_DCT:
    case DCT_FLIPADST:
    case FLIPADST_FLIPADST:
    case ADST_FLIPADST:
    case FLIPADST_ADST:
      highbd_inv_txfm2d_add_no_identity_sse41(
          input, CONVERT_TO_SHORTPTR(output), stride, tx_type, tx_size, eob,
          bd);
      break;
    case V_DCT:
    case V_ADST:
    case V_FLIPADST:
      highbd_inv_txfm2d_add_h_identity_ssse41(
          input, CONVERT_TO_SHORTPTR(output), stride, tx_type, tx_size, eob,
          bd);
      break;
    case H_DCT:
    case H_ADST:
    case H_FLIPADST:
      highbd_inv_txfm2d_add_v_identity_ssse41(
          input, CONVERT_TO_SHORTPTR(output), stride, tx_type, tx_size, eob,
          bd);
      break;
    case IDTX:
      highbd_inv_txfm2d_add_idtx_ssse41(input, CONVERT_TO_SHORTPTR(output),
                                        stride, tx_type, tx_size, eob, bd);
      break;
    default: assert(0); break;
  }
}